

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pq_test.cpp
# Opt level: O3

void __thiscall
priorityQueueTest_random_large_Test::~priorityQueueTest_random_large_Test
          (priorityQueueTest_random_large_Test *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x18);
  return;
}

Assistant:

TEST_F(priorityQueueTest,random_large) {
    std::random_device rand_dev;

    std::default_random_engine e(810);
    std::uniform_real_distribution<double> dis(0, 100);

    std::priority_queue<double> std_pq;
    Priority_queue pq;

    for (unsigned i = 0; i != 5000000; ++i) {
        double num = dis(e);
        std_pq.push(num);
        pq.push(num);
    }
    ASSERT_DOUBLE_EQ(std_pq.top(), pq.top());
    ASSERT_EQ(std_pq.size(), pq.size());
}